

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::anon_unknown_0::ReconstructMaterialBindingProperties
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *table,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       *properties,MaterialBinding *mb,string *err)

{
  string *psVar1;
  _Base_ptr p_Var2;
  string *psVar3;
  _Rb_tree_node_base *p_Var4;
  int iVar5;
  int iVar6;
  long *plVar7;
  const_iterator cVar8;
  undefined8 *puVar9;
  _Base_ptr p_Var10;
  ulong uVar11;
  ulong uVar12;
  ostream *poVar13;
  mapped_type *pmVar14;
  uint *args;
  undefined **in;
  char *pcVar15;
  uint uVar16;
  undefined8 unaff_RBP;
  char *pcVar17;
  long lVar18;
  _Rb_tree_node_base *p_Var19;
  bool bVar20;
  string collection_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  ostringstream ss_e;
  undefined1 local_270 [32];
  string *local_250;
  undefined1 local_248 [36];
  uint local_224;
  _Rb_tree_node_base *local_220;
  _Rb_tree_node_base *local_218;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_210;
  _Base_ptr local_208;
  MaterialBinding *local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  optional<tinyusdz::Relationship> *local_1d8;
  optional<tinyusdz::Relationship> *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1b0 [112];
  ios_base local_140 [264];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
  *local_38;
  
  if (mb == (MaterialBinding *)0x0) {
    uVar12 = 0;
  }
  else {
    p_Var10 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var19 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
    uVar12 = CONCAT71((int7)((ulong)unaff_RBP >> 8),p_Var10 == p_Var19);
    if (p_Var10 != p_Var19) {
      local_208 = (_Base_ptr)&(table->_M_t)._M_impl.super__Rb_tree_header;
      local_1d0 = &mb->materialBindingPreview;
      local_1d8 = &mb->materialBindingFull;
      local_38 = &mb->_materialBindingCollectionMap;
      args = (uint *)err;
      local_250 = err;
      local_218 = p_Var19;
      local_210 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   *)table;
      local_200 = mb;
      do {
        local_220 = p_Var10 + 1;
        iVar6 = ::std::__cxx11::string::compare((char *)local_220);
        if (iVar6 == 0) {
          local_1b0._0_8_ = (string *)(local_1b0 + 0x10);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1b0,"material:binding","");
          cVar8 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_210,(key_type *)local_1b0);
          if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
            operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
          }
          p_Var19 = local_218;
          iVar6 = 3;
          if (cVar8._M_node == local_208) {
            uVar16 = (uint)uVar12;
            if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
              if (*(uint *)&p_Var10[0x17]._M_left < 4) {
                args = &switchD_00235167::switchdataD_003f7750;
                switch(*(uint *)&p_Var10[0x17]._M_left) {
                default:
                  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                            (&local_200->materialBinding,(Relationship *)&p_Var10[0x17]._M_left);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            (local_210,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_220);
                  iVar6 = 0;
                  bVar20 = true;
                  goto LAB_002369d1;
                case 2:
                  if ((long)p_Var10[0x1e]._M_left - (long)p_Var10[0x1e]._M_parent != 0xd0) {
                    local_224 = uVar16;
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"():",3);
                    poVar13 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1b0,0x9f0);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                    pcVar17 = "`{}` target is empty or has mutiple Paths. Must be single Path.";
                    pcVar15 = "";
                    goto LAB_002361be;
                  }
                case 1:
                  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                            (&local_200->materialBinding,(Relationship *)&p_Var10[0x17]._M_left);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            (local_210,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_220);
                  iVar6 = 3;
                }
              }
              else {
                local_224 = uVar16;
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
                poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x9f0);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                pcVar17 = "Internal error. Property `{}` is not a valid Relationship.";
                pcVar15 = "";
LAB_002361be:
                local_248._0_8_ = (string *)(local_248 + 0x10);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_248,pcVar17,pcVar15);
                fmt::format<char_const*>
                          ((string *)local_270,(fmt *)local_248,(string *)&kMaterialBinding,
                           (char **)args);
                poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b0,(char *)local_270._0_8_,local_270._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                  operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                }
                psVar1 = local_250;
                if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                  operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                }
                p_Var19 = local_218;
                uVar12 = (ulong)local_224;
                if (psVar1 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  puVar9 = (undefined8 *)
                           ::std::__cxx11::string::_M_append
                                     (local_248,(ulong)(local_250->_M_dataplus)._M_p);
                  args = (uint *)(puVar9 + 2);
                  if ((string *)*puVar9 == (string *)args) {
                    local_270._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                    local_270._24_8_ = puVar9[3];
                    local_270._0_8_ = (string *)(local_270 + 0x10);
                  }
                  else {
                    local_270._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                    local_270._0_8_ = (string *)*puVar9;
                  }
                  local_270._8_8_ = puVar9[1];
                  *puVar9 = args;
                  puVar9[1] = 0;
                  *(undefined1 *)(puVar9 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_250,(string *)local_270);
                  if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                    operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                  }
                  if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                ::std::ios_base::~ios_base(local_140);
                iVar6 = 1;
              }
              bVar20 = false;
LAB_002369d1:
              if (bVar20) goto LAB_00234ff5;
              goto LAB_00235a09;
            }
            local_224 = uVar16;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
            poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x9f0);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            local_248._0_8_ = local_248 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_248,"Property `{}` must be a Relationship.","");
            in = &kMaterialBinding;
            goto LAB_002358bd;
          }
        }
        else {
LAB_00234ff5:
          iVar6 = ::std::__cxx11::string::compare((char *)local_220);
          if (iVar6 == 0) {
            local_1b0._0_8_ = (string *)(local_1b0 + 0x10);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b0,"material:binding:preview","");
            cVar8 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_210,(key_type *)local_1b0);
            if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
              operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
            }
            p_Var19 = local_218;
            iVar6 = 3;
            if (cVar8._M_node != local_208) goto LAB_00235a09;
            uVar16 = (uint)uVar12;
            if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
              if (*(uint *)&p_Var10[0x17]._M_left < 4) {
                args = &switchD_00235237::switchdataD_003f7760;
                switch(*(uint *)&p_Var10[0x17]._M_left) {
                default:
                  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                            (local_1d0,(Relationship *)&p_Var10[0x17]._M_left);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            (local_210,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_220);
                  iVar6 = 0;
                  bVar20 = true;
                  goto LAB_00236bf7;
                case 2:
                  if ((long)p_Var10[0x1e]._M_left - (long)p_Var10[0x1e]._M_parent != 0xd0) {
                    local_224 = uVar16;
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"():",3);
                    poVar13 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1b0,0x9f1);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                    pcVar17 = "`{}` target is empty or has mutiple Paths. Must be single Path.";
                    pcVar15 = "";
                    goto LAB_00236a95;
                  }
                case 1:
                  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                            (local_1d0,(Relationship *)&p_Var10[0x17]._M_left);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            (local_210,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_220);
                  iVar6 = 3;
                }
              }
              else {
                local_224 = uVar16;
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
                poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x9f1);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                pcVar17 = "Internal error. Property `{}` is not a valid Relationship.";
                pcVar15 = "";
LAB_00236a95:
                local_248._0_8_ = (string *)(local_248 + 0x10);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_248,pcVar17,pcVar15);
                fmt::format<char_const*>
                          ((string *)local_270,(fmt *)local_248,(string *)&kMaterialBindingPreview,
                           (char **)args);
                poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b0,(char *)local_270._0_8_,local_270._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                  operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                }
                psVar1 = local_250;
                if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                  operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                }
                p_Var19 = local_218;
                uVar12 = (ulong)local_224;
                if (psVar1 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  puVar9 = (undefined8 *)
                           ::std::__cxx11::string::_M_append
                                     (local_248,(ulong)(local_250->_M_dataplus)._M_p);
                  args = (uint *)(puVar9 + 2);
                  if ((string *)*puVar9 == (string *)args) {
                    local_270._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                    local_270._24_8_ = puVar9[3];
                    local_270._0_8_ = (string *)(local_270 + 0x10);
                  }
                  else {
                    local_270._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                    local_270._0_8_ = (string *)*puVar9;
                  }
                  local_270._8_8_ = puVar9[1];
                  *puVar9 = args;
                  puVar9[1] = 0;
                  *(undefined1 *)(puVar9 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_250,(string *)local_270);
                  if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                    operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                  }
                  if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                ::std::ios_base::~ios_base(local_140);
                iVar6 = 1;
              }
              bVar20 = false;
LAB_00236bf7:
              if (!bVar20) goto LAB_00235a09;
              goto LAB_0023500a;
            }
            local_224 = uVar16;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
            iVar6 = 0x9f1;
LAB_0023586f:
            poVar13 = (ostream *)::std::ostream::operator<<(local_1b0,iVar6);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
            local_248._0_8_ = local_248 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_248,"Property `{}` must be a Relationship.","");
            in = &kMaterialBindingPreview;
LAB_002358bd:
            fmt::format<char_const*>
                      ((string *)local_270,(fmt *)local_248,(string *)in,(char **)args);
            poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,(char *)local_270._0_8_,local_270._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
            psVar1 = (string *)(local_270 + 0x10);
            if ((string *)local_270._0_8_ != psVar1) {
              operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
            }
            if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
              operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
            }
            p_Var19 = local_218;
            if (local_250 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              puVar9 = (undefined8 *)
                       ::std::__cxx11::string::_M_append
                                 (local_248,(ulong)(local_250->_M_dataplus)._M_p);
              args = (uint *)(puVar9 + 2);
              if ((string *)*puVar9 == (string *)args) {
                local_270._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                local_270._24_8_ = puVar9[3];
                local_270._0_8_ = psVar1;
              }
              else {
                local_270._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                local_270._0_8_ = (string *)*puVar9;
              }
              local_270._8_8_ = puVar9[1];
              *puVar9 = args;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_250,(string *)local_270);
              p_Var19 = local_218;
              if ((string *)local_270._0_8_ != psVar1) {
                operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
              }
              if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
            ::std::ios_base::~ios_base(local_140);
            iVar5 = 1;
LAB_00235a05:
            iVar6 = iVar5;
            uVar12 = (ulong)local_224;
          }
          else {
LAB_0023500a:
            iVar6 = ::std::__cxx11::string::compare((char *)local_220);
            if (iVar6 == 0) {
              local_1b0._0_8_ = (string *)(local_1b0 + 0x10);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1b0,"material:binding:preview","");
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_210,(key_type *)local_1b0);
              if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
                operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
              }
              p_Var19 = local_218;
              iVar6 = 3;
              if (cVar8._M_node != local_208) goto LAB_00235a09;
              if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                local_224 = (uint)uVar12;
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
                iVar6 = 0x9f2;
                goto LAB_0023586f;
              }
              psVar1 = (string *)(local_248 + 0x10);
              if (*(uint *)&p_Var10[0x17]._M_left < 4) {
                args = &switchD_0023530a::switchdataD_003f7770;
                switch(*(uint *)&p_Var10[0x17]._M_left) {
                default:
                  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                            (local_1d8,(Relationship *)&p_Var10[0x17]._M_left);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            (local_210,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_220);
                  iVar6 = 0;
                  bVar20 = true;
                  goto LAB_00237600;
                case 2:
                  if ((long)p_Var10[0x1e]._M_left - (long)p_Var10[0x1e]._M_parent != 0xd0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"():",3);
                    poVar13 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1b0,0x9f2);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                    local_248._0_8_ = psVar1;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_248,
                               "`{}` target is empty or has mutiple Paths. Must be single Path.","")
                    ;
                    fmt::format<char_const*>
                              ((string *)local_270,(fmt *)local_248,
                               (string *)&kMaterialBindingPreview,(char **)args);
                    poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1b0,(char *)local_270._0_8_,
                                         local_270._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                    if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                      operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                    }
                    psVar3 = local_250;
                    if ((string *)local_248._0_8_ != psVar1) {
                      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                    }
                    p_Var19 = local_218;
                    if (psVar3 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      puVar9 = (undefined8 *)
                               ::std::__cxx11::string::_M_append
                                         (local_248,(ulong)(local_250->_M_dataplus)._M_p);
                      args = (uint *)(puVar9 + 2);
                      if ((string *)*puVar9 == (string *)args) {
                        local_270._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                        local_270._24_8_ = puVar9[3];
                        local_270._0_8_ = (string *)(local_270 + 0x10);
                      }
                      else {
                        local_270._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                        local_270._0_8_ = (string *)*puVar9;
                      }
                      local_270._8_8_ = puVar9[1];
                      *puVar9 = args;
                      puVar9[1] = 0;
                      *(undefined1 *)(puVar9 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)local_250,(string *)local_270);
                      if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                        operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                      }
                      if ((string *)local_248._0_8_ != psVar1) {
                        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                      }
                    }
                    goto LAB_002375d7;
                  }
                case 1:
                  nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                            (local_1d8,(Relationship *)&p_Var10[0x17]._M_left);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            (local_210,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_220);
                  iVar6 = 3;
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
                poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x9f2);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                local_248._0_8_ = psVar1;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_248,
                           "Internal error. Property `{}` is not a valid Relationship.","");
                fmt::format<char_const*>
                          ((string *)local_270,(fmt *)local_248,(string *)&kMaterialBindingPreview,
                           (char **)args);
                poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b0,(char *)local_270._0_8_,local_270._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                  operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                }
                psVar1 = local_250;
                if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                  operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                }
                if (psVar1 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  psVar1 = local_250;
                  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_270,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_248,local_250);
                  ::std::__cxx11::string::operator=((string *)psVar1,(string *)local_270);
                  if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                    operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                  }
                  if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                  }
                }
LAB_002375d7:
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                ::std::ios_base::~ios_base(local_140);
                iVar6 = 1;
              }
              bVar20 = false;
LAB_00237600:
              if (!bVar20) goto LAB_00235a09;
            }
            p_Var4 = local_220;
            local_224 = (uint)uVar12;
            iVar6 = ::std::__cxx11::string::compare((char *)local_220);
            if (iVar6 == 0) {
              cVar8 = ::std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_210,(key_type *)p_Var4);
              iVar6 = 3;
              iVar5 = 3;
              if (cVar8._M_node != local_208) goto LAB_00235a05;
              if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                local_1b0._0_8_ = local_1b0 + 0x10;
                local_1b0._8_8_ = (_Base_ptr)0x0;
                local_1b0._16_8_ = local_1b0._16_8_ & 0xffffffffffffff00;
                ::std::__cxx11::string::_M_replace((ulong)local_1b0,0,(char *)0x0,0x40307f);
                local_270._0_8_ = local_270 + 0x10;
                local_270._8_8_ = 0;
                local_270._16_8_ = local_270._16_8_ & 0xffffffffffffff00;
                args = (uint *)0x40307f;
                ::std::__cxx11::string::_M_replace((ulong)local_270,0,(char *)0x0,0x40307f);
                pmVar14 = ::std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
                          ::operator[](local_38,(key_type *)local_1b0);
                ordered_dict<tinyusdz::Relationship>::insert
                          (pmVar14,(string *)local_270,(Relationship *)&p_Var10[0x17]._M_left);
                if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                  operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                }
                p_Var19 = local_218;
                uVar12 = (ulong)local_224;
                if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
                  operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
                }
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          (local_210,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_220);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"():",3);
                poVar13 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1b0,0x9fb);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                local_248._0_8_ = (string *)(local_248 + 0x10);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_248,"`{}` must be a Relationship","");
                fmt::format<std::__cxx11::string>
                          ((string *)local_270,(fmt *)local_248,(string *)local_220,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args
                          );
                poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1b0,(char *)local_270._0_8_,local_270._8_8_);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                  operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                }
                p_Var19 = local_218;
                if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                  operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                }
                uVar12 = (ulong)local_224;
joined_r0x00235b71:
                if (local_250 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  puVar9 = (undefined8 *)
                           ::std::__cxx11::string::_M_append
                                     (local_248,(ulong)(local_250->_M_dataplus)._M_p);
                  args = (uint *)(puVar9 + 2);
                  if ((string *)*puVar9 == (string *)args) {
                    local_270._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                    local_270._24_8_ = puVar9[3];
                    local_270._0_8_ = (string *)(local_270 + 0x10);
                  }
                  else {
                    local_270._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                    local_270._0_8_ = (string *)*puVar9;
                  }
                  local_270._8_8_ = puVar9[1];
                  *puVar9 = args;
                  puVar9[1] = 0;
                  *(undefined1 *)(puVar9 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_250,(string *)local_270);
                  if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                    operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                  }
                  if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                ::std::ios_base::~ios_base(local_140);
                iVar6 = 1;
              }
            }
            else {
              local_270._0_8_ = local_270 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_270,":","");
              plVar7 = (long *)::std::__cxx11::string::replace
                                         ((ulong)local_270,0,(char *)0x0,0x3f9c81);
              local_1b0._0_8_ = local_1b0 + 0x10;
              args = (uint *)(plVar7 + 2);
              if ((string *)*plVar7 == (string *)args) {
                local_1b0._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                local_1b0._24_8_ = plVar7[3];
              }
              else {
                local_1b0._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                local_1b0._0_8_ = (string *)*plVar7;
              }
              local_1b0._8_8_ = plVar7[1];
              *plVar7 = (long)args;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              uVar12 = (ulong)local_224;
              if (p_Var10[1]._M_parent < (ulong)local_1b0._8_8_) {
                bVar20 = false;
              }
              else if ((_Base_ptr)local_1b0._8_8_ == (_Base_ptr)0x0) {
                bVar20 = true;
              }
              else {
                iVar6 = bcmp((void *)local_1b0._0_8_,*(void **)local_220,local_1b0._8_8_);
                bVar20 = iVar6 == 0;
              }
              if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
                operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
              }
              if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
              }
              if (bVar20) {
                cVar8 = ::std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_210,(key_type *)local_220);
                iVar6 = 3;
                if (cVar8._M_node == local_208) {
                  if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"():",3);
                    iVar6 = 0xa0d;
LAB_00235f66:
                    poVar13 = (ostream *)::std::ostream::operator<<((ostream *)local_1b0,iVar6);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                    local_248._0_8_ = (string *)(local_248 + 0x10);
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_248,"`{}` must be a Relationship","");
                    fmt::format<std::__cxx11::string>
                              ((string *)local_270,(fmt *)local_248,(string *)local_220,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               args);
                    poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_1b0,(char *)local_270._0_8_,
                                         local_270._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                    if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                      operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                    }
                    p_Var19 = local_218;
                    if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                      p_Var19 = local_218;
                    }
                    goto joined_r0x00235b71;
                  }
                  local_248._0_8_ = local_248 + 0x10;
                  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,":","");
                  puVar9 = (undefined8 *)
                           ::std::__cxx11::string::replace((ulong)local_248,0,(char *)0x0,0x3f9c81);
                  p_Var19 = local_220;
                  args = (uint *)(puVar9 + 2);
                  if ((string *)*puVar9 == (string *)args) {
                    local_1b0._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                    local_1b0._24_8_ = puVar9[3];
                    local_1b0._0_8_ = (string *)(local_1b0 + 0x10);
                  }
                  else {
                    local_1b0._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                    local_1b0._0_8_ = (string *)*puVar9;
                  }
                  local_1b0._8_8_ = puVar9[1];
                  *puVar9 = args;
                  puVar9[1] = 0;
                  *(undefined1 *)(puVar9 + 2) = 0;
                  p_Var2 = p_Var10[1]._M_parent;
                  if ((p_Var2 < (ulong)local_1b0._8_8_) ||
                     (((_Base_ptr)local_1b0._8_8_ != (_Base_ptr)0x0 &&
                      (iVar6 = bcmp((void *)local_1b0._0_8_,*(void **)local_220,local_1b0._8_8_),
                      iVar6 != 0)))) {
                    local_270._0_8_ = local_270 + 0x10;
                    lVar18 = *(long *)p_Var19;
                    ::std::__cxx11::string::_M_construct<char*>
                              ((string *)local_270,lVar18,(long)&p_Var2->_M_color + lVar18);
                  }
                  else {
                    args = (uint *)0xffffffffffffffff;
                    ::std::__cxx11::string::substr((ulong)local_270,(ulong)p_Var19);
                  }
                  p_Var19 = local_218;
                  if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
                    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
                  }
                  psVar1 = (string *)(local_248 + 0x10);
                  if ((string *)local_248._0_8_ != psVar1) {
                    operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                  }
                  if (local_270._8_8_ == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"():",3);
                    poVar13 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1b0,0xa12);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,
                               "empty NAME is not allowed for \'mateirial:binding:collection\'",0x3c
                              );
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"\n",1);
                    if (local_250 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      puVar9 = (undefined8 *)
                               ::std::__cxx11::string::_M_append
                                         ((char *)&local_1f8,(ulong)(local_250->_M_dataplus)._M_p);
                      args = (uint *)(puVar9 + 2);
                      if ((string *)*puVar9 == (string *)args) {
                        local_248._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                        local_248._24_8_ = puVar9[3];
                        local_248._0_8_ = psVar1;
                      }
                      else {
                        local_248._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                        local_248._0_8_ = (string *)*puVar9;
                      }
                      local_248._8_8_ = puVar9[1];
                      *puVar9 = args;
                      puVar9[1] = 0;
                      *(undefined1 *)(puVar9 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)local_250,(string *)local_248);
                      if ((string *)local_248._0_8_ != psVar1) {
                        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                        operator_delete(local_1f8._M_dataplus._M_p,
                                        local_1f8.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                    ::std::ios_base::~ios_base(local_140);
                    iVar6 = 1;
                  }
                  else {
                    local_248._0_8_ = psVar1;
                    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,":","");
                    local_1c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_1c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_1c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    lVar18 = 0x147ae15;
                    uVar12 = 0;
                    do {
                      args = (uint *)local_248._8_8_;
                      uVar11 = ::std::__cxx11::string::find_first_not_of
                                         (local_270,local_248._0_8_,uVar12);
                      if (uVar11 == 0xffffffffffffffff) break;
                      uVar12 = ::std::__cxx11::string::find(local_270,local_248._0_8_,uVar11);
                      args = (uint *)(uVar12 - uVar11);
                      ::std::__cxx11::string::substr((ulong)local_1b0,(ulong)local_270);
                      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      emplace_back<std::__cxx11::string>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)&local_1c8,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1b0);
                      if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
                        operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
                      }
                      lVar18 = lVar18 + -1;
                    } while (lVar18 != 0);
                    if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                    }
                    psVar1 = local_250;
                    uVar12 = (ulong)local_224;
                    if ((ulong)((long)local_1c8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
                      local_1b0._8_8_ = (_Base_ptr)0x0;
                      local_1b0._16_8_ = local_1b0._16_8_ & 0xffffffffffffff00;
                      local_1b0._0_8_ = (string *)(local_1b0 + 0x10);
                      if ((long)local_1c8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1c8.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start != 0x20) {
                        local_248._8_8_ = (string *)0x0;
                        local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
                        local_248._0_8_ = (string *)(local_248 + 0x10);
                        ::std::__cxx11::string::_M_assign((string *)local_248);
                        ::std::__cxx11::string::operator=((string *)local_1b0,(string *)local_248);
                        if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                          operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                        }
                      }
                      ::std::__cxx11::string::_M_assign((string *)local_270);
                      local_248._8_8_ = (string *)0x0;
                      local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
                      local_248._0_8_ = (string *)(local_248 + 0x10);
                      ::std::__cxx11::string::_M_assign((string *)local_248);
                      pmVar14 = ::std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ordered_dict<tinyusdz::Relationship>_>_>_>
                                ::operator[](local_38,(key_type *)local_248);
                      ordered_dict<tinyusdz::Relationship>::insert
                                (pmVar14,(string *)local_1b0,(Relationship *)&p_Var10[0x17]._M_left)
                      ;
                      if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                      }
                      ::std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>
                                (local_210,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_220);
                      p_Var19 = local_218;
                      if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
                        operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
                      }
LAB_002374a6:
                      iVar6 = 3;
                    }
                    else {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"():",3);
                      poVar13 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_1b0,0xa16);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,
                                 "3 or more namespaces is not allowed for \'mateirial:binding:collection\'"
                                 ,0x46);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"\n",1);
                      p_Var19 = local_218;
                      if (psVar1 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        psVar1 = local_250;
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_248,&local_1f8,local_250);
                        ::std::__cxx11::string::operator=((string *)psVar1,(string *)local_248);
                        if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                          operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                          operator_delete(local_1f8._M_dataplus._M_p,
                                          local_1f8.field_2._M_allocated_capacity + 1);
                        }
                      }
LAB_00237278:
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                      ::std::ios_base::~ios_base(local_140);
                      iVar6 = 1;
                    }
                    ::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_1c8);
                  }
LAB_00237556:
                  if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                    operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                  }
                }
              }
              else {
                local_270._0_8_ = local_270 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_270,":","");
                puVar9 = (undefined8 *)
                         ::std::__cxx11::string::replace((ulong)local_270,0,(char *)0x0,0x3f9c32);
                args = (uint *)(puVar9 + 2);
                if ((string *)*puVar9 == (string *)args) {
                  local_1b0._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                  local_1b0._24_8_ = puVar9[3];
                  local_1b0._0_8_ = (string *)(local_1b0 + 0x10);
                }
                else {
                  local_1b0._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                  local_1b0._0_8_ = (string *)*puVar9;
                }
                local_1b0._8_8_ = puVar9[1];
                *puVar9 = args;
                puVar9[1] = 0;
                *(undefined1 *)(puVar9 + 2) = 0;
                if (p_Var10[1]._M_parent < (ulong)local_1b0._8_8_) {
                  bVar20 = false;
                }
                else if ((_Base_ptr)local_1b0._8_8_ == (_Base_ptr)0x0) {
                  bVar20 = true;
                }
                else {
                  iVar6 = bcmp((void *)local_1b0._0_8_,*(void **)local_220,local_1b0._8_8_);
                  bVar20 = iVar6 == 0;
                }
                if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
                  operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
                }
                if ((string *)local_270._0_8_ != (string *)(local_270 + 0x10)) {
                  operator_delete((void *)local_270._0_8_,(ulong)(local_270._16_8_ + 1));
                }
                p_Var19 = local_218;
                iVar6 = 0;
                if (bVar20) {
                  cVar8 = ::std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_210,(key_type *)local_220);
                  iVar6 = 3;
                  if (cVar8._M_node == local_208) {
                    if (((ulong)p_Var10[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"():",3);
                      iVar6 = 0xa2f;
                      goto LAB_00235f66;
                    }
                    local_248._0_8_ = local_248 + 0x10;
                    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,":","");
                    puVar9 = (undefined8 *)
                             ::std::__cxx11::string::replace
                                       ((ulong)local_248,0,(char *)0x0,0x3f9c32);
                    p_Var19 = local_220;
                    args = (uint *)(puVar9 + 2);
                    if ((string *)*puVar9 == (string *)args) {
                      local_1b0._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                      local_1b0._24_8_ = puVar9[3];
                      local_1b0._0_8_ = (string *)(local_1b0 + 0x10);
                    }
                    else {
                      local_1b0._16_8_ = (((string *)args)->_M_dataplus)._M_p;
                      local_1b0._0_8_ = (string *)*puVar9;
                    }
                    local_1b0._8_8_ = puVar9[1];
                    *puVar9 = args;
                    puVar9[1] = 0;
                    *(undefined1 *)(puVar9 + 2) = 0;
                    p_Var2 = p_Var10[1]._M_parent;
                    if ((p_Var2 < (ulong)local_1b0._8_8_) ||
                       (((_Base_ptr)local_1b0._8_8_ != (_Base_ptr)0x0 &&
                        (iVar6 = bcmp((void *)local_1b0._0_8_,*(void **)local_220,local_1b0._8_8_),
                        iVar6 != 0)))) {
                      local_270._0_8_ = local_270 + 0x10;
                      lVar18 = *(long *)p_Var19;
                      ::std::__cxx11::string::_M_construct<char*>
                                ((string *)local_270,lVar18,(long)&p_Var2->_M_color + lVar18);
                    }
                    else {
                      args = (uint *)0xffffffffffffffff;
                      ::std::__cxx11::string::substr((ulong)local_270,(ulong)p_Var19);
                    }
                    p_Var19 = local_218;
                    if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
                      operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
                    }
                    psVar1 = (string *)(local_248 + 0x10);
                    if ((string *)local_248._0_8_ != psVar1) {
                      operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                    }
                    if (local_270._8_8_ != 0) {
                      local_248._0_8_ = psVar1;
                      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_248,":","");
                      local_1c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      local_1c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      local_1c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      lVar18 = 0x147ae15;
                      uVar12 = 0;
                      do {
                        args = (uint *)local_248._8_8_;
                        uVar11 = ::std::__cxx11::string::find_first_not_of
                                           (local_270,local_248._0_8_,uVar12);
                        if (uVar11 == 0xffffffffffffffff) break;
                        uVar12 = ::std::__cxx11::string::find(local_270,local_248._0_8_,uVar11);
                        args = (uint *)(uVar12 - uVar11);
                        ::std::__cxx11::string::substr((ulong)local_1b0,(ulong)local_270);
                        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        emplace_back<std::__cxx11::string>
                                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&local_1c8,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_1b0);
                        if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
                          operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
                        }
                        lVar18 = lVar18 + -1;
                      } while (lVar18 != 0);
                      if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                      }
                      p_Var19 = local_218;
                      p_Var4 = local_220;
                      uVar12 = (ulong)local_224;
                      if ((ulong)((long)local_1c8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_1c8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
                        local_1b0._8_8_ = (_Base_ptr)0x0;
                        local_1b0._16_8_ = local_1b0._16_8_ & 0xffffffffffffff00;
                        local_1b0._0_8_ = (string *)(local_1b0 + 0x10);
                        ::std::__cxx11::string::_M_assign((string *)local_1b0);
                        MaterialBinding::set_materialBinding
                                  (local_200,(Relationship *)&p_Var10[0x17]._M_left,
                                   (token *)local_1b0);
                        ::std::
                        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        ::_M_insert_unique<std::__cxx11::string_const&>
                                  (local_210,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)p_Var4);
                        if ((string *)local_1b0._0_8_ != (string *)(local_1b0 + 0x10)) {
                          operator_delete((void *)local_1b0._0_8_,(ulong)(local_1b0._16_8_ + 1));
                        }
                        goto LAB_002374a6;
                      }
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                 ,0x5a);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1b0,"():",3);
                      poVar13 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_1b0,0xa38);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1f8,
                                 "PURPOSE `{}` must not have nested namespaces for \'mateirial:binding\'"
                                 ,"");
                      fmt::format<std::__cxx11::string>
                                ((string *)local_248,(fmt *)&local_1f8,(string *)local_270,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)args);
                      poVar13 = ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_1b0,(char *)local_248._0_8_,
                                           local_248._8_8_);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
                      if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                      }
                      psVar1 = local_250;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                        operator_delete(local_1f8._M_dataplus._M_p,
                                        local_1f8.field_2._M_allocated_capacity + 1);
                      }
                      if (psVar1 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        psVar1 = local_250;
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_248,&local_1f8,local_250);
                        ::std::__cxx11::string::operator=((string *)psVar1,(string *)local_248);
                        if ((string *)local_248._0_8_ != (string *)(local_248 + 0x10)) {
                          operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                          operator_delete(local_1f8._M_dataplus._M_p,
                                          local_1f8.field_2._M_allocated_capacity + 1);
                        }
                      }
                      goto LAB_00237278;
                    }
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"ReconstructMaterialBindingProperties",0x24);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"():",3);
                    poVar13 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_1b0,0xa34);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar13," ",1);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,
                               "empty PURPOSE is not allowed for \'mateirial:binding:\'",0x35);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1b0,"\n",1);
                    if (local_250 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      psVar3 = local_250;
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_248,&local_1f8,local_250);
                      ::std::__cxx11::string::operator=((string *)psVar3,(string *)local_248);
                      if ((string *)local_248._0_8_ != psVar1) {
                        operator_delete((void *)local_248._0_8_,(ulong)(local_248._16_8_ + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                        operator_delete(local_1f8._M_dataplus._M_p,
                                        local_1f8.field_2._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
                    ::std::ios_base::~ios_base(local_140);
                    iVar6 = 1;
                    goto LAB_00237556;
                  }
                }
              }
            }
          }
        }
LAB_00235a09:
        if ((iVar6 != 3) && (iVar6 != 0)) break;
        p_Var10 = (_Base_ptr)::std::_Rb_tree_increment(p_Var10);
        uVar12 = CONCAT71((int7)(uVar12 >> 8),p_Var10 == p_Var19);
      } while (p_Var10 != p_Var19);
    }
  }
  return (bool)((byte)uVar12 & 1);
}

Assistant:

bool ReconstructMaterialBindingProperties(
  std::set<std::string> &table, /* inout */
  const std::map<std::string, Property> &properties,
  MaterialBinding *mb, /* inout */
  std::string *err)
{

  if (!mb) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kMaterialBinding, mb->materialBinding)
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kMaterialBindingPreview, mb->materialBindingPreview)
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kMaterialBindingPreview, mb->materialBindingFull)
    // material:binding:collection
    if (prop.first == kMaterialBindingCollection) {

      if (table.count(prop.first)) {
         continue;
      }

      if (!prop.second.is_relationship()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
      }

      const Relationship &rel = prop.second.get_relationship();

      mb->set_materialBindingCollection(value::token(""), value::token(""), rel);

      table.insert(prop.first);
      continue;
    }
    // material:binding:collection[:PURPOSE]:NAME
    if (startsWith(prop.first, kMaterialBindingCollection + std::string(":"))) {

      if (table.count(prop.first)) {
         continue;
      }

      if (!prop.second.is_relationship()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
      }

      std::string collection_name = removePrefix(prop.first, kMaterialBindingCollection + std::string(":"));
      if (collection_name.empty()) {
        PUSH_ERROR_AND_RETURN("empty NAME is not allowed for 'mateirial:binding:collection'");
      }
      std::vector<std::string> names = split(collection_name, ":");
      if (names.size() > 2) {
        PUSH_ERROR_AND_RETURN("3 or more namespaces is not allowed for 'mateirial:binding:collection'");
      }
      value::token mat_purpose; // empty = all-purpose
      if (names.size() == 1) {
        collection_name = names[0];
      } else {
        mat_purpose = value::token(names[0]);
        collection_name = names[1];
      }

      const Relationship &rel = prop.second.get_relationship();

      mb->set_materialBindingCollection(value::token(collection_name), mat_purpose, rel);

      table.insert(prop.first);
      continue;
    }
    // material:binding:PURPOSE
    if (startsWith(prop.first, kMaterialBinding + std::string(":"))) {

      if (table.count(prop.first)) {
         continue;
      }

      if (!prop.second.is_relationship()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`{}` must be a Relationship", prop.first));
      }

      std::string purpose_name = removePrefix(prop.first, kMaterialBinding + std::string(":"));
      if (purpose_name.empty()) {
        PUSH_ERROR_AND_RETURN("empty PURPOSE is not allowed for 'mateirial:binding:'");
      }
      std::vector<std::string> names = split(purpose_name, ":");
      if (names.size() > 1) {
        PUSH_ERROR_AND_RETURN(fmt::format("PURPOSE `{}` must not have nested namespaces for 'mateirial:binding'", purpose_name));
      }
      value::token mat_purpose = value::token(names[0]);

      const Relationship &rel = prop.second.get_relationship();

      mb->set_materialBinding(rel, mat_purpose);

      table.insert(prop.first);
      continue;
    }
  }

  return true;
}